

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O3

void LEARNER::process_example(vw *all,example *ec)

{
  char *__s1;
  int iVar1;
  single_learner *psVar2;
  
  if ((ulong)((long)(ec->super_example_predict).indices._end -
             (long)(ec->super_example_predict).indices._begin) < 2) {
    if (ec->end_pass == true) {
      dispatch_end_pass(all,ec);
      return;
    }
    __s1 = (ec->tag)._begin;
    if (3 < (ulong)((long)(ec->tag)._end - (long)__s1)) {
      iVar1 = strncmp(__s1,"save",4);
      if (iVar1 == 0) {
        save(all,ec);
        return;
      }
    }
  }
  vw::learn(all,ec);
  psVar2 = as_singleline<char,char>(all->l);
  (**(code **)(psVar2 + 0x68))(all,*(undefined8 *)(psVar2 + 0x58),ec);
  return;
}

Assistant:

void process_example(vw& all, example* ec)
{
  if (ec->indices.size() > 1)  // 1+ nonconstant feature. (most common case first)
    dispatch_example(all, *ec);
  else if (ec->end_pass)
    dispatch_end_pass(all, *ec);
  else if (is_save_cmd(ec))
    save(all, ec);
  else
    dispatch_example(all, *ec);
}